

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physics.cpp
# Opt level: O2

int main(void)

{
  ulong uVar1;
  ulong uVar2;
  pointer pNVar3;
  result_type rVar4;
  ostream *poVar5;
  int iVar6;
  ulong uVar7;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *intersections;
  vector<Node_*,_std::allocator<Node_*>_> *in_R8;
  Node *node_1;
  undefined1 auVar8 [8];
  Node *node;
  bool bVar9;
  reference rVar10;
  undefined1 auStack_108 [8];
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> intersections3;
  param_type local_e8;
  uniform_int_distribution<int> deathDistribution;
  default_random_engine generator;
  undefined1 local_c8 [8];
  vector<bool,_std::allocator<bool>_> removed;
  vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
  intersections1;
  _Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
  local_78 [2];
  undefined1 auStack_68 [8];
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> intersections2;
  undefined1 local_48 [8];
  vector<Node,_std::allocator<Node>_> nodes;
  
  generateRandomNodes((vector<Node,_std::allocator<Node>_> *)local_48,1000);
  intersections1.
  super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::make_unique<quadtree::Quadtree<Node*,main::__0,std::equal_to<Node*>,float>::Node>();
  std::chrono::_V2::steady_clock::now();
  pNVar3 = nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (auVar8 = local_48; auVar8 != (undefined1  [8])pNVar3;
      auVar8 = (undefined1  [8])((long)auVar8 + 0x18)) {
    local_c8 = auVar8;
    quadtree::
    Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
    ::add((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
           *)local_78[0]._M_head_impl,(Node *)0x0,
          (size_t)&intersections1.
                   super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(Box<float> *)local_c8,
          (Node **)in_R8);
  }
  deathDistribution._M_param._M_a = 1;
  deathDistribution._M_param._M_b = 0;
  local_e8._M_a = 0;
  local_e8._M_b = 1;
  removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       (_Bit_pointer)
       ((ulong)removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_c8,
             ((long)nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)local_48) / 0x18,
             (bool *)&removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage,(allocator_type *)auStack_68);
  iVar6 = 0;
  auVar8 = local_c8;
  while ((pNVar3 = nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start,
         auVar8 != (undefined1  [8])
                   removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ ||
         (iVar6 != (int)removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p))) {
    rVar4 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_e8,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &deathDistribution);
    uVar7 = 1L << ((byte)iVar6 & 0x3f);
    if (rVar4 == 0) {
      uVar2._0_4_ = (((pointer)auVar8)->box).left;
      uVar2._4_4_ = (((pointer)auVar8)->box).top;
      uVar7 = ~uVar7 & uVar2;
    }
    else {
      uVar1._0_4_ = (((pointer)auVar8)->box).left;
      uVar1._4_4_ = (((pointer)auVar8)->box).top;
      uVar7 = uVar7 | uVar1;
    }
    (((pointer)auVar8)->box).left = (float)(int)uVar7;
    (((pointer)auVar8)->box).top = (float)(int)(uVar7 >> 0x20);
    bVar9 = iVar6 == 0x3f;
    iVar6 = iVar6 + 1;
    auVar8 = (undefined1  [8])(&(((pointer)auVar8)->box).left + (ulong)bVar9 * 2);
    if (bVar9) {
      iVar6 = 0;
    }
  }
  for (auVar8 = local_48; auVar8 != (undefined1  [8])pNVar3;
      auVar8 = (undefined1  [8])((long)auVar8 + 0x18)) {
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_c8,((pointer)auVar8)->id);
    if ((*rVar10._M_p & rVar10._M_mask) != 0) {
      removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)auVar8;
      quadtree::
      Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
      ::remove((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                *)local_78[0]._M_head_impl,
               (char *)&intersections1.
                        super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::
  vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
  ::vector((vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
            *)&removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage,
           ((long)nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_start - (long)local_48) / 0x18,
           (allocator_type *)auStack_68);
  std::chrono::_V2::steady_clock::now();
  for (auVar8 = local_48;
      auVar8 != (undefined1  [8])
                nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start; auVar8 = (undefined1  [8])((long)auVar8 + 0x18)) {
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_c8,((pointer)auVar8)->id);
    if ((*rVar10._M_p & rVar10._M_mask) == 0) {
      auStack_68 = (undefined1  [8])0x0;
      intersections2.
      super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      intersections2.
      super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      quadtree::
      Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
      ::query((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
               *)local_78[0]._M_head_impl,
              (Node *)&intersections1.
                       super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(Box<float> *)auVar8,
              (Box<float> *)auStack_68,in_R8);
      std::vector<Node_*,_std::allocator<Node_*>_>::_M_move_assign
                ((vector<Node_*,_std::allocator<Node_*>_> *)
                 (removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage + ((pointer)auVar8)->id * 3),
                 (Box<float> *)auStack_68);
      std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
                ((_Vector_base<Node_*,_std::allocator<Node_*>_> *)auStack_68);
    }
  }
  std::chrono::_V2::steady_clock::now();
  std::chrono::_V2::steady_clock::now();
  poVar5 = std::operator<<((ostream *)&std::cout,"quadtree: ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  poVar5 = std::operator<<(poVar5,"us");
  std::operator<<(poVar5,'\n');
  poVar5 = std::operator<<((ostream *)&std::cout,"quadtree with creation: ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  poVar5 = std::operator<<(poVar5,"us");
  std::operator<<(poVar5,'\n');
  computeIntersections
            ((vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)
             auStack_68,(vector<Node,_std::allocator<Node>_> *)local_48,
             (vector<bool,_std::allocator<bool>_> *)local_c8);
  auStack_108 = (undefined1  [8])0x0;
  intersections3.
  super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  intersections3.
  super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  quadtree::
  Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
  ::findAllIntersections
            ((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
              *)local_78[0]._M_head_impl,(Node *)auStack_108,intersections);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::operator<<(poVar5,'\n');
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::operator<<(poVar5,'\n');
  std::_Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>::
  ~_Vector_base((_Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                 *)auStack_108);
  std::_Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>::
  ~_Vector_base((_Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                 *)auStack_68);
  std::
  vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
  ::~vector((vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
             *)&removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)local_c8);
  std::
  unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  ::~unique_ptr((unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                 *)local_78);
  std::_Vector_base<Node,_std::allocator<Node>_>::~_Vector_base
            ((_Vector_base<Node,_std::allocator<Node>_> *)local_48);
  return 0;
}

Assistant:

int main()
{
    auto n = std::size_t(1000);
    auto getBox = [](Node* node)
    {
        return node->box;
    };
    auto box = Box(0.0f, 0.0f, 1.0f, 1.0f);
    auto nodes = generateRandomNodes(n);
    // Add nodes to quadtree
    auto quadtree = Quadtree<Node*, decltype(getBox)>(box, getBox);
    auto start1 = std::chrono::steady_clock::now();
    for (auto& node : nodes)
        quadtree.add(&node);
    // Randomly remove some nodes
    auto generator = std::default_random_engine();
    auto deathDistribution = std::uniform_int_distribution(0, 1);
    auto removed = std::vector<bool>(nodes.size(), false);
    std::generate(std::begin(removed), std::end(removed),
        [&generator, &deathDistribution](){ return deathDistribution(generator); });
    for (auto& node : nodes)
    {
        if (removed[node.id])
            quadtree.remove(&node);
    }
    // Quadtree
    auto intersections1 = std::vector<std::vector<Node*>>(nodes.size());
    auto start2 = std::chrono::steady_clock::now();
    for (const auto& node : nodes)
    {
        if (!removed[node.id])
            intersections1[node.id] = quadtree.query(node.box);
    }
    auto duration2 = std::chrono::steady_clock::now() - start2;
    auto duration1 = std::chrono::steady_clock::now() - start1;
    std::cout << "quadtree: " << std::chrono::duration_cast<std::chrono::microseconds>(duration2).count() << "us" << '\n';
    std::cout << "quadtree with creation: " << std::chrono::duration_cast<std::chrono::microseconds>(duration1).count() << "us" << '\n';
    // Brute force
    auto intersections2 = computeIntersections(nodes, removed);
    // Check
    //checkIntersections(intersections1[node.id], intersections2[node.id]);
    // Find all intersections
    auto intersections3 = quadtree.findAllIntersections();
    std::cout << intersections3.size() << '\n';
    std::cout << intersections2.size() << '\n';

    return 0;
}